

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern(UnicodeSet *this,UnicodeString *pattern,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  int32_t i;
  ParsePosition pos;
  int local_2c;
  ParsePosition local_28;
  
  local_28.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b9398;
  local_28.index = 0;
  local_28.errorIndex = -1;
  applyPatternIgnoreSpace(this,pattern,&local_28,(SymbolTable *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_2c = local_28.index;
    ICU_Utility::skipWhitespace(pattern,&local_2c,'\x01');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (local_2c != iVar2) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  ParsePosition::~ParsePosition(&local_28);
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                                     UErrorCode& status) {
    // Equivalent to
    //   return applyPattern(pattern, USET_IGNORE_SPACE, NULL, status);
    // but without dependency on closeOver().
    ParsePosition pos(0);
    applyPatternIgnoreSpace(pattern, pos, NULL, status);
    if (U_FAILURE(status)) return *this;

    int32_t i = pos.getIndex();
    // Skip over trailing whitespace
    ICU_Utility::skipWhitespace(pattern, i, TRUE);
    if (i != pattern.length()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}